

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int planxythetalat(PlannerType plannerType,char *envCfgFilename,char *motPrimFilename,
                  bool forwardSearch)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  pointer psVar4;
  char cVar5;
  int iVar6;
  anaPlanner *this;
  FILE *__stream;
  reference pvVar7;
  SBPL_Exception *pSVar8;
  size_t i;
  ulong uVar9;
  char *__s;
  uint uVar10;
  int theta;
  int y;
  vector<int,_std::allocator<int>_> solution_stateIDs_V;
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> perimeterptsV;
  MDPConfig MDPCfg;
  vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> xythetaPath;
  value_type local_238;
  ADPlanner *local_228;
  undefined8 local_220;
  undefined8 local_218;
  EnvironmentNAVXYTHETALAT environment_navxythetalat;
  
  perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.x = -0.01;
  local_238.y = -0.01;
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::push_back(&perimeterptsV,&local_238);
  local_238.x = 0.01;
  local_238.y = -0.01;
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::push_back(&perimeterptsV,&local_238);
  local_238.x = 0.01;
  local_238.y = 0.01;
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::push_back(&perimeterptsV,&local_238);
  local_238.x = -0.01;
  local_238.y = 0.01;
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::push_back(&perimeterptsV,&local_238);
  if (perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
      super__Vector_impl_data._M_start) {
    perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
    super__Vector_impl_data._M_finish =
         perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  EnvironmentNAVXYTHETALAT::EnvironmentNAVXYTHETALAT(&environment_navxythetalat);
  cVar5 = EnvironmentNAVXYTHETALATTICE::InitializeEnv
                    ((char *)&environment_navxythetalat,(vector *)envCfgFilename,
                     (char *)&perimeterptsV);
  if (cVar5 == '\0') {
    pSVar8 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(pSVar8,"ERROR: InitializeEnv failed");
LAB_0010782f:
    __cxa_throw(pSVar8,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  cVar5 = EnvironmentNAVXYTHETALATTICE::InitializeMDPCfg((MDPConfig *)&environment_navxythetalat);
  if (cVar5 == '\0') {
    pSVar8 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(pSVar8,"ERROR: InitializeMDPCfg failed");
    goto LAB_0010782f;
  }
  solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  switch(plannerType) {
  case PLANNER_TYPE_ADSTAR:
    puts("Initializing ADPlanner...");
    this = (anaPlanner *)operator_new(0x98);
    ADPlanner::ADPlanner
              ((ADPlanner *)this,(DiscreteSpaceInformation *)&environment_navxythetalat,
               forwardSearch);
    break;
  case PLANNER_TYPE_ARASTAR:
    puts("Initializing ARAPlanner...");
    this = (anaPlanner *)operator_new(0xa0);
    ARAPlanner::ARAPlanner
              ((ARAPlanner *)this,(DiscreteSpaceInformation *)&environment_navxythetalat,
               forwardSearch);
    break;
  default:
    puts("Invalid planner type");
    this = (anaPlanner *)0x0;
    break;
  case PLANNER_TYPE_RSTAR:
    puts("Invalid configuration: xytheta environment does not support rstar planner...");
    iVar6 = 0;
    goto LAB_001077c4;
  case PLANNER_TYPE_ANASTAR:
    puts("Initializing anaPlanner...");
    this = (anaPlanner *)operator_new(0x48);
    anaPlanner::anaPlanner
              (this,(DiscreteSpaceInformation *)&environment_navxythetalat,forwardSearch);
  }
  iVar6 = (**(code **)(*(long *)this + 0x28))(this,MDPCfg.startstateid);
  if (iVar6 == 0) {
    puts("ERROR: failed to set start state");
    pSVar8 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(pSVar8,"ERROR: failed to set start state");
  }
  else {
    iVar6 = (**(code **)(*(long *)this + 0x20))(this,MDPCfg.goalstateid);
    if (iVar6 != 0) {
      (**(code **)(*(long *)this + 0x90))(0,this);
      (**(code **)(*(long *)this + 0x40))(this,0);
      puts("start planning...");
      iVar6 = (*(code *)**(undefined8 **)this)(0,this,&solution_stateIDs_V);
      puts("done planning");
      printf("size of solution=%d\n",
             (ulong)((long)solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2);
      EnvironmentNAVXYTHETALATTICE::PrintTimeStat((_IO_FILE *)&environment_navxythetalat);
      local_228 = (ADPlanner *)this;
      __stream = fopen("sol.txt","w");
      if (__stream == (FILE *)0x0) {
        pSVar8 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
        SBPL_Exception::SBPL_Exception(pSVar8,"ERROR: could not open solution file");
        __cxa_throw(pSVar8,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
      }
      for (uVar9 = 0;
          uVar9 < (ulong)((long)solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 2); uVar9 = uVar9 + 1) {
        EnvironmentNAVXYTHETALAT::GetCoordFromState
                  ((int)&environment_navxythetalat,
                   (int *)(ulong)(uint)solution_stateIDs_V.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start[uVar9],(int *)&xythetaPath,
                   &y);
        psVar4 = xythetaPath.
                 super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>._M_impl
                 .super__Vector_impl_data._M_start;
        iVar2 = y;
        iVar3 = (int)xythetaPath.
                     super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
                     _M_impl.super__Vector_impl_data._M_start;
        uVar1 = DiscTheta2Cont(theta,0x10);
        fprintf(__stream,"%d %d %d\t\t%.3f %.3f %.3f\n",SUB84((double)iVar3 * 0.1 + 0.05,0),
                (double)iVar2 * 0.1 + 0.05,uVar1,(ulong)psVar4 & 0xffffffff,(ulong)(uint)iVar2,
                (ulong)(uint)theta);
      }
      xythetaPath.super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      xythetaPath.super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      xythetaPath.super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      EnvironmentNAVXYTHETALAT::ConvertStateIDPathintoXYThetaPath
                ((vector *)&environment_navxythetalat,(vector *)&solution_stateIDs_V);
      printf("solution size=%d\n",
             ((long)xythetaPath.
                    super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)xythetaPath.
                   super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x18 & 0xffffffff,
             ((long)xythetaPath.
                    super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)xythetaPath.
                   super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
                   _M_impl.super__Vector_impl_data._M_start) % 0x18);
      for (uVar10 = 0; uVar9 = (ulong)uVar10,
          uVar9 < (ulong)(((long)xythetaPath.
                                 super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)xythetaPath.
                                super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x18);
          uVar10 = uVar10 + 1) {
        pvVar7 = std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::at
                           (&xythetaPath,uVar9);
        local_218 = *(undefined8 *)pvVar7;
        pvVar7 = std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::at
                           (&xythetaPath,uVar9);
        local_220 = *(undefined8 *)(pvVar7 + 8);
        pvVar7 = std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::at
                           (&xythetaPath,uVar9);
        fprintf(__stream,"%.3f %.3f %.3f\n",(int)local_218,local_220,*(undefined8 *)(pvVar7 + 0x10))
        ;
      }
      fclose(__stream);
      EnvironmentNAVXYTHETALATTICE::PrintTimeStat((_IO_FILE *)&environment_navxythetalat);
      __s = "Solution is found";
      if (iVar6 == 0) {
        __s = "Solution does not exist";
      }
      puts(__s);
      fflush((FILE *)0x0);
      (**(code **)(*(long *)local_228 + 0xa0))();
      std::_Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::~_Vector_base
                (&xythetaPath.
                  super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>);
LAB_001077c4:
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>);
      EnvironmentNAVXYTHETALAT::~EnvironmentNAVXYTHETALAT(&environment_navxythetalat);
      std::_Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::~_Vector_base
                (&perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>);
      return iVar6;
    }
    puts("ERROR: failed to set goal state");
    pSVar8 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(pSVar8,"ERROR: failed to set goal state");
  }
  __cxa_throw(pSVar8,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int planxythetalat(PlannerType plannerType, char* envCfgFilename, char* motPrimFilename, bool forwardSearch)
{
    int bRet = 0;
    double allocated_time_secs = 10.0; // in seconds
    double initialEpsilon = 3.0;
    MDPConfig MDPCfg;
    bool bsearchuntilfirstsolution = false;
    bool bforwardsearch = forwardSearch;

    // set the perimeter of the robot (it is given with 0,0,0 robot ref. point for which planning is done)
    vector<sbpl_2Dpt_t> perimeterptsV;
    sbpl_2Dpt_t pt_m;
    double halfwidth = 0.01; //0.3;
    double halflength = 0.01; //0.45;
    pt_m.x = -halflength;
    pt_m.y = -halfwidth;
    perimeterptsV.push_back(pt_m);
    pt_m.x = halflength;
    pt_m.y = -halfwidth;
    perimeterptsV.push_back(pt_m);
    pt_m.x = halflength;
    pt_m.y = halfwidth;
    perimeterptsV.push_back(pt_m);
    pt_m.x = -halflength;
    pt_m.y = halfwidth;
    perimeterptsV.push_back(pt_m);

    // clear the footprint
    perimeterptsV.clear();

    // Initialize Environment (should be called before initializing anything else)
    EnvironmentNAVXYTHETALAT environment_navxythetalat;

    if (!environment_navxythetalat.InitializeEnv(envCfgFilename, perimeterptsV, motPrimFilename)) {
        throw SBPL_Exception("ERROR: InitializeEnv failed");
    }

    // Initialize MDP Info
    if (!environment_navxythetalat.InitializeMDPCfg(&MDPCfg)) {
        throw SBPL_Exception("ERROR: InitializeMDPCfg failed");
    }

    // plan a path
    vector<int> solution_stateIDs_V;

    SBPLPlanner* planner = NULL;
    switch (plannerType) {
    case PLANNER_TYPE_ARASTAR:
        printf("Initializing ARAPlanner...\n");
        planner = new ARAPlanner(&environment_navxythetalat, bforwardsearch);
        break;
    case PLANNER_TYPE_ADSTAR:
        printf("Initializing ADPlanner...\n");
        planner = new ADPlanner(&environment_navxythetalat, bforwardsearch);
        break;
    case PLANNER_TYPE_RSTAR:
        printf("Invalid configuration: xytheta environment does not support rstar planner...\n");
        return 0;
    case PLANNER_TYPE_ANASTAR:
        printf("Initializing anaPlanner...\n");
        planner = new anaPlanner(&environment_navxythetalat, bforwardsearch);
        break;
    default:
        printf("Invalid planner type\n");
        break;
    }

    // set planner properties
    if (planner->set_start(MDPCfg.startstateid) == 0) {
        printf("ERROR: failed to set start state\n");
        throw SBPL_Exception("ERROR: failed to set start state");
    }
    if (planner->set_goal(MDPCfg.goalstateid) == 0) {
        printf("ERROR: failed to set goal state\n");
        throw SBPL_Exception("ERROR: failed to set goal state");
    }
    planner->set_initialsolution_eps(initialEpsilon);
    planner->set_search_mode(bsearchuntilfirstsolution);

    // plan
    printf("start planning...\n");
    bRet = planner->replan(allocated_time_secs, &solution_stateIDs_V);
    printf("done planning\n");
    printf("size of solution=%d\n", (unsigned int)solution_stateIDs_V.size());

    environment_navxythetalat.PrintTimeStat(stdout);

    // write solution to sol.txt
    const char* sol = "sol.txt";
    FILE* fSol = fopen(sol, "w");
    if (fSol == NULL) {
        throw SBPL_Exception("ERROR: could not open solution file");
    }

    // write the discrete solution to file
    for (size_t i = 0; i < solution_stateIDs_V.size(); i++) {
        int x;
        int y;
        int theta;
        environment_navxythetalat.GetCoordFromState(solution_stateIDs_V[i], x, y, theta);
        fprintf(fSol, "%d %d %d\t\t%.3f %.3f %.3f\n", x, y, theta, DISCXY2CONT(x, 0.1), DISCXY2CONT(y, 0.1), DiscTheta2Cont(theta, 16));
    }

    // write the continuous solution to file
    vector<sbpl_xy_theta_pt_t> xythetaPath;
    environment_navxythetalat.ConvertStateIDPathintoXYThetaPath(&solution_stateIDs_V, &xythetaPath);
    printf("solution size=%d\n", (unsigned int)xythetaPath.size());
    for (unsigned int i = 0; i < xythetaPath.size(); i++) {
        fprintf(fSol, "%.3f %.3f %.3f\n", xythetaPath.at(i).x, xythetaPath.at(i).y, xythetaPath.at(i).theta);
    }
    fclose(fSol);

    environment_navxythetalat.PrintTimeStat(stdout);

    // print a path
    if (bRet) {
        // print the solution
        printf("Solution is found\n");
    }
    else {
        printf("Solution does not exist\n");
    }

    fflush(NULL);

    delete planner;

    return bRet;
}